

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O1

void __thiscall
tchecker::intvar_info_t::intvar_info_t
          (intvar_info_t *this,uint size,integer_t min,integer_t max,integer_t initial_value)

{
  invalid_argument *this_00;
  
  size_info_t::size_info_t(&this->super_size_info_t,size);
  this->_min = min;
  this->_max = max;
  this->_initial_value = initial_value;
  if ((min <= initial_value) && (initial_value <= max)) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"expecting min <= initial_value <= max");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

intvar_info_t::intvar_info_t(unsigned int size, tchecker::integer_t min, tchecker::integer_t max,
                             tchecker::integer_t initial_value)
    : tchecker::size_info_t(size), _min(min), _max(max), _initial_value(initial_value)
{
  if ((_min > _initial_value) || (_initial_value > _max))
    throw std::invalid_argument("expecting min <= initial_value <= max");
}